

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O3

void Abc_FrameCheckPoConstTest(Abc_Frame_t *p)

{
  uint uVar1;
  uint iPoNum;
  
  if (0 < p->pNtkCur->vPos->nSize) {
    iPoNum = 0;
    do {
      uVar1 = Abc_FrameCheckPoConst(p,iPoNum);
      printf("%d = %d\n",(ulong)iPoNum,(ulong)uVar1);
      iPoNum = iPoNum + 1;
    } while ((int)iPoNum < p->pNtkCur->vPos->nSize);
  }
  return;
}

Assistant:

void Abc_FrameCheckPoConstTest( Abc_Frame_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachPo( p->pNtkCur, pObj, i )
        printf( "%d = %d\n", i, Abc_FrameCheckPoConst(p, i) );
}